

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

void __thiscall Fl_Tree_Item::show_self(Fl_Tree_Item *this,char *indent)

{
  uint uVar1;
  Fl_Tree_Item *pFVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int t;
  long lVar6;
  
  pcVar5 = "(NULL)";
  if (this->_label != (char *)0x0) {
    pcVar5 = this->_label;
  }
  uVar1 = (this->_children)._total;
  pFVar2 = this->_parent;
  iVar3 = depth(this);
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",indent,pcVar5,(ulong)uVar1,this,pFVar2
         ,iVar3);
  iVar3 = (this->_children)._total;
  if (iVar3 != 0) {
    sVar4 = strlen(indent);
    pcVar5 = (char *)operator_new__(sVar4 + 2);
    strcpy(pcVar5,indent);
    sVar4 = strlen(pcVar5);
    (pcVar5 + sVar4)[0] = ' ';
    (pcVar5 + sVar4)[1] = '|';
    pcVar5[sVar4 + 2] = '\0';
    for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
      show_self((this->_children)._items[lVar6],pcVar5);
      iVar3 = (this->_children)._total;
    }
    operator_delete__(pcVar5);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fl_Tree_Item::show_self(const char *indent) const {
  const char *thelabel = label() ? label() : "(NULL)";
#if FLTK_ABI_VERSION >= 10301
  printf("%s-%s (%d children, this=%p, parent=%p, prev=%p, next=%p, depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent,
	 _prev_sibling, _next_sibling, depth());
#else /*FLTK_ABI_VERSION*/
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent, depth());
#endif /*FLTK_ABI_VERSION*/
  if ( children() ) {
    char *i2 = new char [strlen(indent)+2];
    strcpy(i2, indent);
    strcat(i2, " |");
    for ( int t=0; t<children(); t++ ) {
      child(t)->show_self(i2);
    }
    delete[] i2;
  }
  fflush(stdout);
}